

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O3

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitUnary
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          Unary *curr)

{
  size_t sVar1;
  uint line;
  Literal *this_00;
  char *pcVar2;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Literal local_b08;
  Literal local_af0;
  Literal local_ad8;
  Literal local_ac0;
  Literal local_aa8;
  Literal local_a90;
  Literal local_a78;
  Literal local_a60;
  Literal local_a48;
  Literal local_a30;
  Literal local_a18;
  Literal local_a00;
  Literal local_9e8;
  Literal local_9d0;
  Literal local_9b8;
  Literal local_9a0;
  Literal local_988;
  Literal local_970;
  Literal local_958;
  Literal local_940;
  Literal local_928;
  Literal local_910;
  Literal local_8f8;
  Literal local_8e0;
  Literal local_8c8;
  Literal local_8b0;
  Literal local_898;
  Literal local_880;
  Literal local_868;
  Literal local_850;
  Literal local_838;
  Literal local_820;
  Literal local_808;
  Literal local_7f0;
  Literal local_7d8;
  Literal local_7c0;
  Literal local_7a8;
  Literal local_790;
  Literal local_778;
  Literal local_760;
  Literal local_748;
  Literal local_730;
  Literal local_718;
  Literal local_700;
  Literal local_6e8;
  Literal local_6d0;
  Literal local_6b8;
  Literal local_6a0;
  Literal local_688;
  Literal local_670;
  Literal local_658;
  Literal local_640;
  Literal local_628;
  Literal local_610;
  Literal local_5f8;
  Literal local_5e0;
  Literal local_5c8;
  Literal local_5b0;
  Literal local_598;
  Literal local_580;
  Literal local_568;
  Literal local_550;
  Literal local_538;
  Literal local_520;
  Literal local_508;
  Literal local_4f0;
  Literal local_4d8;
  Literal local_4c0;
  Literal local_4a8;
  Literal local_490;
  Literal local_478;
  Literal local_460;
  Literal local_448;
  Literal local_430;
  Literal local_418;
  Literal local_400;
  Literal local_3e8;
  Literal local_3d0;
  Literal local_3b8;
  Literal local_3a0;
  Literal local_388;
  Literal local_370;
  Literal local_358;
  Literal local_340;
  Literal local_328;
  Literal local_310;
  Literal local_2f8;
  Literal local_2e0;
  Literal local_2c8;
  Literal local_2b0;
  Literal local_298;
  Literal local_280;
  Literal local_268;
  Literal local_250;
  Literal local_238;
  Literal local_220;
  Literal local_208;
  Literal local_1f0;
  Literal local_1d8;
  Literal local_1c0;
  Literal local_1a8;
  Literal local_190;
  Literal local_178;
  Literal local_160;
  Literal local_148;
  Literal local_130;
  Literal local_118;
  Literal local_100;
  Literal local_e8;
  Literal local_d0;
  Literal local_b8;
  Literal local_a0;
  undefined1 local_88 [8];
  Flow flow;
  Literal value;
  
  visit((Flow *)local_88,this,curr->value);
  if (flow.breakTo.super_IString.str._M_len != 0) {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         (size_t)local_88;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,(Literal *)&flow);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         (size_t)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         (char *)flow.breakTo.super_IString.str._M_len;
    goto LAB_00a16de3;
  }
  if (((long)((long)flow.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                    super__Vector_impl_data._M_start -
             flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id) >> 3) *
      -0x5555555555555555 + (long)local_88 != 1) {
    __assert_fail("values.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                  ,0x52,"const Literal &wasm::Flow::getSingleValue()");
  }
  Literal::Literal((Literal *)&flow.breakTo.super_IString.str._M_str,(Literal *)&flow);
  pcVar2 = DAT_010b2358;
  sVar1 = NONCONSTANT_FLOW;
  switch(curr->op) {
  case ClzInt32:
  case ClzInt64:
    Literal::countLeadingZeroes(&local_b08,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_b08);
    this_00 = &local_b08;
    break;
  case CtzInt32:
  case CtzInt64:
    Literal::countTrailingZeroes(&local_af0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_af0);
    this_00 = &local_af0;
    break;
  case PopcntInt32:
  case PopcntInt64:
    Literal::popCount(&local_ad8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_ad8);
    this_00 = &local_ad8;
    break;
  case NegFloat32:
  case NegFloat64:
    Literal::neg(&local_988,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_988);
    this_00 = &local_988;
    break;
  case AbsFloat32:
  case AbsFloat64:
    Literal::abs(&local_970,(int)&flow + 0x40);
    Flow::Flow(__return_storage_ptr__,&local_970);
    this_00 = &local_970;
    break;
  case CeilFloat32:
  case CeilFloat64:
    Literal::ceil(&local_958,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Flow::Flow(__return_storage_ptr__,&local_958);
    this_00 = &local_958;
    break;
  case FloorFloat32:
  case FloorFloat64:
    Literal::floor(&local_940,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Flow::Flow(__return_storage_ptr__,&local_940);
    this_00 = &local_940;
    break;
  case TruncFloat32:
  case TruncFloat64:
    Literal::trunc(&local_928,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Flow::Flow(__return_storage_ptr__,&local_928);
    this_00 = &local_928;
    break;
  case NearestFloat32:
  case NearestFloat64:
    Literal::nearbyint(&local_910,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Flow::Flow(__return_storage_ptr__,&local_910);
    this_00 = &local_910;
    break;
  case SqrtFloat32:
  case SqrtFloat64:
    Literal::sqrt(&local_8f8,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    Flow::Flow(__return_storage_ptr__,&local_8f8);
    this_00 = &local_8f8;
    break;
  case EqZInt32:
  case EqZInt64:
    Literal::eqz(&local_ac0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_ac0);
    this_00 = &local_ac0;
    break;
  case ExtendSInt32:
    Literal::extendToSI64(&local_a78,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a78);
    this_00 = &local_a78;
    break;
  case ExtendUInt32:
    Literal::extendToUI64(&local_a60,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a60);
    this_00 = &local_a60;
    break;
  case WrapInt64:
    Literal::wrapToI32(&local_a48,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a48);
    this_00 = &local_a48;
    break;
  case TruncSFloat32ToInt32:
  case TruncSFloat32ToInt64:
  case TruncSFloat64ToInt32:
  case TruncSFloat64ToInt64:
    Literal::Literal(&local_8c8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    truncSFloat(&local_8e0,this,curr,&local_8c8);
    Flow::Flow(__return_storage_ptr__,&local_8e0);
    Literal::~Literal(&local_8e0);
    this_00 = &local_8c8;
    break;
  case TruncUFloat32ToInt32:
  case TruncUFloat32ToInt64:
  case TruncUFloat64ToInt32:
  case TruncUFloat64ToInt64:
    Literal::Literal(&local_898,(Literal *)&flow.breakTo.super_IString.str._M_str);
    truncUFloat(&local_8b0,this,curr,&local_898);
    Flow::Flow(__return_storage_ptr__,&local_8b0);
    Literal::~Literal(&local_8b0);
    this_00 = &local_898;
    break;
  case ReinterpretFloat32:
    Literal::castToI32(&local_820,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_820);
    this_00 = &local_820;
    break;
  case ReinterpretFloat64:
    Literal::castToI64(&local_7f0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_7f0);
    this_00 = &local_7f0;
    break;
  case ConvertSInt32ToFloat32:
  case ConvertSInt64ToFloat32:
    Literal::convertSIToF32(&local_a00,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a00);
    this_00 = &local_a00;
    break;
  case ConvertSInt32ToFloat64:
  case ConvertSInt64ToFloat64:
    Literal::convertSIToF64(&local_9e8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_9e8);
    this_00 = &local_9e8;
    break;
  case ConvertUInt32ToFloat32:
  case ConvertUInt64ToFloat32:
    Literal::convertUIToF32(&local_a30,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a30);
    this_00 = &local_a30;
    break;
  case ConvertUInt32ToFloat64:
  case ConvertUInt64ToFloat64:
    Literal::convertUIToF64(&local_a18,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a18);
    this_00 = &local_a18;
    break;
  case PromoteFloat32:
    Literal::extendToF64(&local_808,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_808);
    this_00 = &local_808;
    break;
  case DemoteFloat64:
    Literal::demote(&local_7d8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_7d8);
    this_00 = &local_7d8;
    break;
  case ReinterpretInt32:
    Literal::castToF32(&local_aa8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_aa8);
    this_00 = &local_aa8;
    break;
  case ReinterpretInt64:
    Literal::castToF64(&local_a90,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a90);
    this_00 = &local_a90;
    break;
  case ExtendS8Int32:
  case ExtendS8Int64:
    Literal::extendS8(&local_9d0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_9d0);
    this_00 = &local_9d0;
    break;
  case ExtendS16Int32:
  case ExtendS16Int64:
    Literal::extendS16(&local_9b8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_9b8);
    this_00 = &local_9b8;
    break;
  case ExtendS32Int64:
    Literal::extendS32(&local_9a0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_9a0);
    this_00 = &local_9a0;
    break;
  case TruncSatSFloat32ToInt32:
  case TruncSatSFloat64ToInt32:
    Literal::truncSatToSI32(&local_880,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_880);
    this_00 = &local_880;
    break;
  case TruncSatUFloat32ToInt32:
  case TruncSatUFloat64ToInt32:
    Literal::truncSatToUI32(&local_850,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_850);
    this_00 = &local_850;
    break;
  case TruncSatSFloat32ToInt64:
  case TruncSatSFloat64ToInt64:
    Literal::truncSatToSI64(&local_868,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_868);
    this_00 = &local_868;
    break;
  case TruncSatUFloat32ToInt64:
  case TruncSatUFloat64ToInt64:
    Literal::truncSatToUI64(&local_838,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_838);
    this_00 = &local_838;
    break;
  case SplatVecI8x16:
    Literal::splatI8x16(&local_7c0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_7c0);
    this_00 = &local_7c0;
    break;
  case SplatVecI16x8:
    Literal::splatI16x8(&local_7a8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_7a8);
    this_00 = &local_7a8;
    break;
  case SplatVecI32x4:
    Literal::splatI32x4(&local_790,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_790);
    this_00 = &local_790;
    break;
  case SplatVecI64x2:
    Literal::splatI64x2(&local_778,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_778);
    this_00 = &local_778;
    break;
  case SplatVecF32x4:
    Literal::splatF32x4(&local_748,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_748);
    this_00 = &local_748;
    break;
  case SplatVecF64x2:
    Literal::splatF64x2(&local_730,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_730);
    this_00 = &local_730;
    break;
  case NotVec128:
    Literal::notV128(&local_718,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_718);
    this_00 = &local_718;
    break;
  case AnyTrueVec128:
    Literal::anyTrueV128(&local_700,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_700);
    this_00 = &local_700;
    break;
  case AbsVecI8x16:
    Literal::absI8x16(&local_6e8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_6e8);
    this_00 = &local_6e8;
    break;
  case NegVecI8x16:
    Literal::negI8x16(&local_6d0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_6d0);
    this_00 = &local_6d0;
    break;
  case AllTrueVecI8x16:
    Literal::allTrueI8x16(&local_6b8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_6b8);
    this_00 = &local_6b8;
    break;
  case BitmaskVecI8x16:
    Literal::bitmaskI8x16(&local_6a0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_6a0);
    this_00 = &local_6a0;
    break;
  case PopcntVecI8x16:
    Literal::popcntI8x16(&local_688,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_688);
    this_00 = &local_688;
    break;
  case AbsVecI16x8:
    Literal::absI16x8(&local_670,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_670);
    this_00 = &local_670;
    break;
  case NegVecI16x8:
    Literal::negI16x8(&local_658,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_658);
    this_00 = &local_658;
    break;
  case AllTrueVecI16x8:
    Literal::allTrueI16x8(&local_640,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_640);
    this_00 = &local_640;
    break;
  case BitmaskVecI16x8:
    Literal::bitmaskI16x8(&local_628,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_628);
    this_00 = &local_628;
    break;
  case AbsVecI32x4:
    Literal::absI32x4(&local_610,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_610);
    this_00 = &local_610;
    break;
  case NegVecI32x4:
    Literal::negI32x4(&local_5f8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_5f8);
    this_00 = &local_5f8;
    break;
  case AllTrueVecI32x4:
    Literal::allTrueI32x4(&local_5e0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_5e0);
    this_00 = &local_5e0;
    break;
  case BitmaskVecI32x4:
    Literal::bitmaskI32x4(&local_5c8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_5c8);
    this_00 = &local_5c8;
    break;
  case AbsVecI64x2:
    Literal::absI64x2(&local_5b0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_5b0);
    this_00 = &local_5b0;
    break;
  case NegVecI64x2:
    Literal::negI64x2(&local_598,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_598);
    this_00 = &local_598;
    break;
  case AllTrueVecI64x2:
    Literal::allTrueI64x2(&local_580,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_580);
    this_00 = &local_580;
    break;
  case BitmaskVecI64x2:
    Literal::bitmaskI64x2(&local_568,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_568);
    this_00 = &local_568;
    break;
  case AbsVecF16x8:
    Literal::absF16x8(&local_550,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_550);
    this_00 = &local_550;
    break;
  case NegVecF16x8:
    Literal::negF16x8(&local_538,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_538);
    this_00 = &local_538;
    break;
  case SqrtVecF16x8:
    Literal::sqrtF16x8(&local_520,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_520);
    this_00 = &local_520;
    break;
  case CeilVecF16x8:
    Literal::ceilF16x8(&local_508,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_508);
    this_00 = &local_508;
    break;
  case FloorVecF16x8:
    Literal::floorF16x8(&local_4f0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_4f0);
    this_00 = &local_4f0;
    break;
  case TruncVecF16x8:
    Literal::truncF16x8(&local_4d8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_4d8);
    this_00 = &local_4d8;
    break;
  case NearestVecF16x8:
    Literal::nearestF16x8(&local_4c0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_4c0);
    this_00 = &local_4c0;
    break;
  case AbsVecF32x4:
    Literal::absF32x4(&local_4a8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_4a8);
    this_00 = &local_4a8;
    break;
  case NegVecF32x4:
    Literal::negF32x4(&local_490,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_490);
    this_00 = &local_490;
    break;
  case SqrtVecF32x4:
    Literal::sqrtF32x4(&local_478,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_478);
    this_00 = &local_478;
    break;
  case CeilVecF32x4:
    Literal::ceilF32x4(&local_460,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_460);
    this_00 = &local_460;
    break;
  case FloorVecF32x4:
    Literal::floorF32x4(&local_448,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_448);
    this_00 = &local_448;
    break;
  case TruncVecF32x4:
    Literal::truncF32x4(&local_430,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_430);
    this_00 = &local_430;
    break;
  case NearestVecF32x4:
    Literal::nearestF32x4(&local_418,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_418);
    this_00 = &local_418;
    break;
  case AbsVecF64x2:
    Literal::absF64x2(&local_400,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_400);
    this_00 = &local_400;
    break;
  case NegVecF64x2:
    Literal::negF64x2(&local_3e8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_3e8);
    this_00 = &local_3e8;
    break;
  case SqrtVecF64x2:
    Literal::sqrtF64x2(&local_3d0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_3d0);
    this_00 = &local_3d0;
    break;
  case CeilVecF64x2:
    Literal::ceilF64x2(&local_3b8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_3b8);
    this_00 = &local_3b8;
    break;
  case FloorVecF64x2:
    Literal::floorF64x2(&local_3a0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_3a0);
    this_00 = &local_3a0;
    break;
  case TruncVecF64x2:
    Literal::truncF64x2(&local_388,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_388);
    this_00 = &local_388;
    break;
  case NearestVecF64x2:
    Literal::nearestF64x2(&local_370,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_370);
    this_00 = &local_370;
    break;
  case ExtAddPairwiseSVecI8x16ToI16x8:
    Literal::extAddPairwiseToSI16x8(&local_358,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_358);
    this_00 = &local_358;
    break;
  case ExtAddPairwiseUVecI8x16ToI16x8:
    Literal::extAddPairwiseToUI16x8(&local_340,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_340);
    this_00 = &local_340;
    break;
  case ExtAddPairwiseSVecI16x8ToI32x4:
    Literal::extAddPairwiseToSI32x4(&local_328,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_328);
    this_00 = &local_328;
    break;
  case ExtAddPairwiseUVecI16x8ToI32x4:
    Literal::extAddPairwiseToUI32x4(&local_310,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_310);
    this_00 = &local_310;
    break;
  case TruncSatSVecF32x4ToVecI32x4:
switchD_00a15acc_caseD_6e:
    Literal::truncSatToSI32x4(&local_2f8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_2f8);
    this_00 = &local_2f8;
    break;
  case ConvertSVecI32x4ToVecF32x4:
    Literal::convertSToF32x4(&local_2c8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_2c8);
    this_00 = &local_2c8;
    break;
  case ConvertUVecI32x4ToVecF32x4:
    Literal::convertUToF32x4(&local_2b0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_2b0);
    this_00 = &local_2b0;
    break;
  case ExtendLowSVecI8x16ToVecI16x8:
    Literal::extendLowSToI16x8(&local_298,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_298);
    this_00 = &local_298;
    break;
  case ExtendHighSVecI8x16ToVecI16x8:
    Literal::extendHighSToI16x8(&local_280,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_280);
    this_00 = &local_280;
    break;
  case ExtendLowUVecI8x16ToVecI16x8:
    Literal::extendLowUToI16x8(&local_268,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_268);
    this_00 = &local_268;
    break;
  case ExtendHighUVecI8x16ToVecI16x8:
    Literal::extendHighUToI16x8(&local_250,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_250);
    this_00 = &local_250;
    break;
  case ExtendLowSVecI16x8ToVecI32x4:
    Literal::extendLowSToI32x4(&local_238,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_238);
    this_00 = &local_238;
    break;
  case ExtendHighSVecI16x8ToVecI32x4:
    Literal::extendHighSToI32x4(&local_220,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_220);
    this_00 = &local_220;
    break;
  case ExtendLowUVecI16x8ToVecI32x4:
    Literal::extendLowUToI32x4(&local_208,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_208);
    this_00 = &local_208;
    break;
  case ExtendHighUVecI16x8ToVecI32x4:
    Literal::extendHighUToI32x4(&local_1f0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_1f0);
    this_00 = &local_1f0;
    break;
  case ExtendLowSVecI32x4ToVecI64x2:
    Literal::extendLowSToI64x2(&local_1d8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_1d8);
    this_00 = &local_1d8;
    break;
  case ExtendHighSVecI32x4ToVecI64x2:
    Literal::extendHighSToI64x2(&local_1c0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_1c0);
    this_00 = &local_1c0;
    break;
  case ExtendLowUVecI32x4ToVecI64x2:
    Literal::extendLowUToI64x2(&local_1a8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_1a8);
    this_00 = &local_1a8;
    break;
  case ExtendHighUVecI32x4ToVecI64x2:
    Literal::extendHighUToI64x2(&local_190,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_190);
    this_00 = &local_190;
    break;
  case ConvertLowSVecI32x4ToVecF64x2:
    Literal::convertLowSToF64x2(&local_178,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_178);
    this_00 = &local_178;
    break;
  case ConvertLowUVecI32x4ToVecF64x2:
    Literal::convertLowUToF64x2(&local_160,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_160);
    this_00 = &local_160;
    break;
  case DemoteZeroVecF64x2ToVecF32x4:
    Literal::demoteZeroToF32x4(&local_118,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_118);
    this_00 = &local_118;
    break;
  case PromoteLowVecF32x4ToVecF64x2:
    Literal::promoteLowToF64x2(&local_100,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_100);
    this_00 = &local_100;
    break;
  case RelaxedTruncSVecF32x4ToVecI32x4:
    if (this->relaxedBehavior != NonConstant) goto switchD_00a15acc_caseD_6e;
LAB_00a16d89:
    *(char **)((long)&(__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                      _M_elems[0].field_0.func.super_IString.str + 8) = (char *)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id
         = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0
    .i64 = 0;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len = sVar1;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str = pcVar2;
    goto LAB_00a16dda;
  case RelaxedTruncUVecF32x4ToVecI32x4:
    if (this->relaxedBehavior == NonConstant) goto LAB_00a16d89;
  case TruncSatUVecF32x4ToVecI32x4:
    Literal::truncSatToUI32x4(&local_2e0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_2e0);
    this_00 = &local_2e0;
    break;
  case RelaxedTruncZeroSVecF64x2ToVecI32x4:
    if (this->relaxedBehavior == NonConstant) goto LAB_00a16d89;
  case TruncSatZeroSVecF64x2ToVecI32x4:
    Literal::truncSatZeroSToI32x4(&local_148,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_148);
    this_00 = &local_148;
    break;
  case RelaxedTruncZeroUVecF64x2ToVecI32x4:
    if (this->relaxedBehavior == NonConstant) goto LAB_00a16d89;
  case TruncSatZeroUVecF64x2ToVecI32x4:
    Literal::truncSatZeroUToI32x4(&local_130,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_130);
    this_00 = &local_130;
    break;
  case SplatVecF16x8:
    Literal::splatF16x8(&local_760,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_760);
    this_00 = &local_760;
    break;
  case TruncSatSVecF16x8ToVecI16x8:
    Literal::truncSatToSI16x8(&local_e8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_e8);
    this_00 = &local_e8;
    break;
  case TruncSatUVecF16x8ToVecI16x8:
    Literal::truncSatToUI16x8(&local_d0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_d0);
    this_00 = &local_d0;
    break;
  case ConvertSVecI16x8ToVecF16x8:
    Literal::convertSToF16x8(&local_b8,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_b8);
    this_00 = &local_b8;
    break;
  case ConvertUVecI16x8ToVecF16x8:
    Literal::convertUToF16x8(&local_a0,(Literal *)&flow.breakTo.super_IString.str._M_str);
    Flow::Flow(__return_storage_ptr__,&local_a0);
    this_00 = &local_a0;
    break;
  case InvalidUnary:
    line = 0x2ac;
    pcVar2 = "invalid unary op";
    goto LAB_00a16e41;
  default:
    line = 0x2ae;
    pcVar2 = "invalid op";
LAB_00a16e41:
    handle_unreachable(pcVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                       ,line);
  }
  Literal::~Literal(this_00);
LAB_00a16dda:
  Literal::~Literal((Literal *)&flow.breakTo.super_IString.str._M_str);
LAB_00a16de3:
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            ((vector<wasm::Literal,_std::allocator<wasm::Literal>_> *)
             &flow.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type);
  Literal::~Literal((Literal *)&flow);
  return __return_storage_ptr__;
}

Assistant:

Flow visitUnary(Unary* curr) {
    NOTE_ENTER("Unary");
    Flow flow = visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    Literal value = flow.getSingleValue();
    NOTE_EVAL1(value);
    switch (curr->op) {
      case ClzInt32:
      case ClzInt64:
        return value.countLeadingZeroes();
      case CtzInt32:
      case CtzInt64:
        return value.countTrailingZeroes();
      case PopcntInt32:
      case PopcntInt64:
        return value.popCount();
      case EqZInt32:
      case EqZInt64:
        return value.eqz();
      case ReinterpretInt32:
        return value.castToF32();
      case ReinterpretInt64:
        return value.castToF64();
      case ExtendSInt32:
        return value.extendToSI64();
      case ExtendUInt32:
        return value.extendToUI64();
      case WrapInt64:
        return value.wrapToI32();
      case ConvertUInt32ToFloat32:
      case ConvertUInt64ToFloat32:
        return value.convertUIToF32();
      case ConvertUInt32ToFloat64:
      case ConvertUInt64ToFloat64:
        return value.convertUIToF64();
      case ConvertSInt32ToFloat32:
      case ConvertSInt64ToFloat32:
        return value.convertSIToF32();
      case ConvertSInt32ToFloat64:
      case ConvertSInt64ToFloat64:
        return value.convertSIToF64();
      case ExtendS8Int32:
      case ExtendS8Int64:
        return value.extendS8();
      case ExtendS16Int32:
      case ExtendS16Int64:
        return value.extendS16();
      case ExtendS32Int64:
        return value.extendS32();
      case NegFloat32:
      case NegFloat64:
        return value.neg();
      case AbsFloat32:
      case AbsFloat64:
        return value.abs();
      case CeilFloat32:
      case CeilFloat64:
        return value.ceil();
      case FloorFloat32:
      case FloorFloat64:
        return value.floor();
      case TruncFloat32:
      case TruncFloat64:
        return value.trunc();
      case NearestFloat32:
      case NearestFloat64:
        return value.nearbyint();
      case SqrtFloat32:
      case SqrtFloat64:
        return value.sqrt();
      case TruncSFloat32ToInt32:
      case TruncSFloat64ToInt32:
      case TruncSFloat32ToInt64:
      case TruncSFloat64ToInt64:
        return truncSFloat(curr, value);
      case TruncUFloat32ToInt32:
      case TruncUFloat64ToInt32:
      case TruncUFloat32ToInt64:
      case TruncUFloat64ToInt64:
        return truncUFloat(curr, value);
      case TruncSatSFloat32ToInt32:
      case TruncSatSFloat64ToInt32:
        return value.truncSatToSI32();
      case TruncSatSFloat32ToInt64:
      case TruncSatSFloat64ToInt64:
        return value.truncSatToSI64();
      case TruncSatUFloat32ToInt32:
      case TruncSatUFloat64ToInt32:
        return value.truncSatToUI32();
      case TruncSatUFloat32ToInt64:
      case TruncSatUFloat64ToInt64:
        return value.truncSatToUI64();
      case ReinterpretFloat32:
        return value.castToI32();
      case PromoteFloat32:
        return value.extendToF64();
      case ReinterpretFloat64:
        return value.castToI64();
      case DemoteFloat64:
        return value.demote();
      case SplatVecI8x16:
        return value.splatI8x16();
      case SplatVecI16x8:
        return value.splatI16x8();
      case SplatVecI32x4:
        return value.splatI32x4();
      case SplatVecI64x2:
        return value.splatI64x2();
      case SplatVecF16x8:
        return value.splatF16x8();
      case SplatVecF32x4:
        return value.splatF32x4();
      case SplatVecF64x2:
        return value.splatF64x2();
      case NotVec128:
        return value.notV128();
      case AnyTrueVec128:
        return value.anyTrueV128();
      case AbsVecI8x16:
        return value.absI8x16();
      case NegVecI8x16:
        return value.negI8x16();
      case AllTrueVecI8x16:
        return value.allTrueI8x16();
      case BitmaskVecI8x16:
        return value.bitmaskI8x16();
      case PopcntVecI8x16:
        return value.popcntI8x16();
      case AbsVecI16x8:
        return value.absI16x8();
      case NegVecI16x8:
        return value.negI16x8();
      case AllTrueVecI16x8:
        return value.allTrueI16x8();
      case BitmaskVecI16x8:
        return value.bitmaskI16x8();
      case AbsVecI32x4:
        return value.absI32x4();
      case NegVecI32x4:
        return value.negI32x4();
      case AllTrueVecI32x4:
        return value.allTrueI32x4();
      case BitmaskVecI32x4:
        return value.bitmaskI32x4();
      case AbsVecI64x2:
        return value.absI64x2();
      case NegVecI64x2:
        return value.negI64x2();
      case AllTrueVecI64x2:
        return value.allTrueI64x2();
      case BitmaskVecI64x2:
        return value.bitmaskI64x2();
      case AbsVecF16x8:
        return value.absF16x8();
      case NegVecF16x8:
        return value.negF16x8();
      case SqrtVecF16x8:
        return value.sqrtF16x8();
      case CeilVecF16x8:
        return value.ceilF16x8();
      case FloorVecF16x8:
        return value.floorF16x8();
      case TruncVecF16x8:
        return value.truncF16x8();
      case NearestVecF16x8:
        return value.nearestF16x8();
      case AbsVecF32x4:
        return value.absF32x4();
      case NegVecF32x4:
        return value.negF32x4();
      case SqrtVecF32x4:
        return value.sqrtF32x4();
      case CeilVecF32x4:
        return value.ceilF32x4();
      case FloorVecF32x4:
        return value.floorF32x4();
      case TruncVecF32x4:
        return value.truncF32x4();
      case NearestVecF32x4:
        return value.nearestF32x4();
      case AbsVecF64x2:
        return value.absF64x2();
      case NegVecF64x2:
        return value.negF64x2();
      case SqrtVecF64x2:
        return value.sqrtF64x2();
      case CeilVecF64x2:
        return value.ceilF64x2();
      case FloorVecF64x2:
        return value.floorF64x2();
      case TruncVecF64x2:
        return value.truncF64x2();
      case NearestVecF64x2:
        return value.nearestF64x2();
      case ExtAddPairwiseSVecI8x16ToI16x8:
        return value.extAddPairwiseToSI16x8();
      case ExtAddPairwiseUVecI8x16ToI16x8:
        return value.extAddPairwiseToUI16x8();
      case ExtAddPairwiseSVecI16x8ToI32x4:
        return value.extAddPairwiseToSI32x4();
      case ExtAddPairwiseUVecI16x8ToI32x4:
        return value.extAddPairwiseToUI32x4();
      case RelaxedTruncSVecF32x4ToVecI32x4:
        // TODO: We could do this only if the actual values are in the relaxed
        //       range.
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatSVecF32x4ToVecI32x4:
        return value.truncSatToSI32x4();
      case RelaxedTruncUVecF32x4ToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatUVecF32x4ToVecI32x4:
        return value.truncSatToUI32x4();
      case ConvertSVecI32x4ToVecF32x4:
        return value.convertSToF32x4();
      case ConvertUVecI32x4ToVecF32x4:
        return value.convertUToF32x4();
      case ExtendLowSVecI8x16ToVecI16x8:
        return value.extendLowSToI16x8();
      case ExtendHighSVecI8x16ToVecI16x8:
        return value.extendHighSToI16x8();
      case ExtendLowUVecI8x16ToVecI16x8:
        return value.extendLowUToI16x8();
      case ExtendHighUVecI8x16ToVecI16x8:
        return value.extendHighUToI16x8();
      case ExtendLowSVecI16x8ToVecI32x4:
        return value.extendLowSToI32x4();
      case ExtendHighSVecI16x8ToVecI32x4:
        return value.extendHighSToI32x4();
      case ExtendLowUVecI16x8ToVecI32x4:
        return value.extendLowUToI32x4();
      case ExtendHighUVecI16x8ToVecI32x4:
        return value.extendHighUToI32x4();
      case ExtendLowSVecI32x4ToVecI64x2:
        return value.extendLowSToI64x2();
      case ExtendHighSVecI32x4ToVecI64x2:
        return value.extendHighSToI64x2();
      case ExtendLowUVecI32x4ToVecI64x2:
        return value.extendLowUToI64x2();
      case ExtendHighUVecI32x4ToVecI64x2:
        return value.extendHighUToI64x2();
      case ConvertLowSVecI32x4ToVecF64x2:
        return value.convertLowSToF64x2();
      case ConvertLowUVecI32x4ToVecF64x2:
        return value.convertLowUToF64x2();
      case RelaxedTruncZeroSVecF64x2ToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatZeroSVecF64x2ToVecI32x4:
        return value.truncSatZeroSToI32x4();
      case RelaxedTruncZeroUVecF64x2ToVecI32x4:
        if (relaxedBehavior == RelaxedBehavior::NonConstant) {
          return NONCONSTANT_FLOW;
        }
        [[fallthrough]];
      case TruncSatZeroUVecF64x2ToVecI32x4:
        return value.truncSatZeroUToI32x4();
      case DemoteZeroVecF64x2ToVecF32x4:
        return value.demoteZeroToF32x4();
      case PromoteLowVecF32x4ToVecF64x2:
        return value.promoteLowToF64x2();
      case TruncSatSVecF16x8ToVecI16x8:
        return value.truncSatToSI16x8();
      case TruncSatUVecF16x8ToVecI16x8:
        return value.truncSatToUI16x8();
      case ConvertSVecI16x8ToVecF16x8:
        return value.convertSToF16x8();
      case ConvertUVecI16x8ToVecF16x8:
        return value.convertUToF16x8();
      case InvalidUnary:
        WASM_UNREACHABLE("invalid unary op");
    }
    WASM_UNREACHABLE("invalid op");
  }